

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O0

void time2str(char *r,curl_off_t seconds)

{
  long lVar1;
  curl_off_t s;
  curl_off_t m;
  curl_off_t h;
  curl_off_t d;
  curl_off_t seconds_local;
  char *r_local;
  
  if (seconds < 1) {
    strcpy(r,"--:--:--");
  }
  else if (seconds / 0xe10 < 100) {
    lVar1 = (seconds % 0xe10) / 0x3c;
    curl_msnprintf(r,9,"%2ld:%02ld:%02ld",seconds / 0xe10,lVar1,seconds % 0xe10 + lVar1 * -0x3c);
  }
  else {
    lVar1 = seconds / 0x15180;
    if (lVar1 < 1000) {
      curl_msnprintf(r,9,"%3ldd %02ldh",lVar1,(seconds % 0x15180) / 0xe10);
    }
    else {
      curl_msnprintf(r,9,"%7ldd",lVar1);
    }
  }
  return;
}

Assistant:

static void time2str(char *r, curl_off_t seconds)
{
  curl_off_t d, h, m, s;
  if(seconds <= 0) {
    strcpy(r, "--:--:--");
    return;
  }
  h = seconds / CURL_OFF_T_C(3600);
  if(h <= CURL_OFF_T_C(99)) {
    m = (seconds - (h*CURL_OFF_T_C(3600))) / CURL_OFF_T_C(60);
    s = (seconds - (h*CURL_OFF_T_C(3600))) - (m*CURL_OFF_T_C(60));
    snprintf(r, 9, "%2" CURL_FORMAT_CURL_OFF_T ":%02" CURL_FORMAT_CURL_OFF_T
             ":%02" CURL_FORMAT_CURL_OFF_T, h, m, s);
  }
  else {
    /* this equals to more than 99 hours, switch to a more suitable output
       format to fit within the limits. */
    d = seconds / CURL_OFF_T_C(86400);
    h = (seconds - (d*CURL_OFF_T_C(86400))) / CURL_OFF_T_C(3600);
    if(d <= CURL_OFF_T_C(999))
      snprintf(r, 9, "%3" CURL_FORMAT_CURL_OFF_T
               "d %02" CURL_FORMAT_CURL_OFF_T "h", d, h);
    else
      snprintf(r, 9, "%7" CURL_FORMAT_CURL_OFF_T "d", d);
  }
}